

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

int mcmswap(mcmcx1def *ctx,ushort siz)

{
  int iVar1;
  long lVar2;
  ushort in_SI;
  long *in_RDI;
  ushort tot;
  int pass;
  mcmon nxt;
  mcmodef *o;
  mcmon n;
  ushort local_22;
  int local_20;
  ushort local_c;
  
  local_22 = 0;
  for (local_20 = 1; local_20 < 3 && local_22 < in_SI; local_20 = local_20 + 1) {
    local_c = *(ushort *)(in_RDI + 0xd);
    while (local_c != 0xffff && local_22 < in_SI) {
      lVar2 = *(long *)(*in_RDI + (long)((int)(uint)local_c >> 8) * 8) +
              (long)(int)(local_c & 0xff) * 0x20;
      local_c = *(ushort *)(lVar2 + 0x10);
      if (((*(ushort *)(lVar2 + 0x14) & 100) == 0) &&
         (((local_20 == 2 || (in_SI <= *(ushort *)(lVar2 + 0x18))) &&
          (iVar1 = mcmtoss(_pass,tot), iVar1 != 0)))) {
        local_22 = local_22 + *(short *)(lVar2 + 0x18);
      }
    }
  }
  return (int)(local_22 != 0);
}

Assistant:

static int mcmswap(mcmcx1def *ctx, ushort siz)
{
    mcmon    n;
    mcmodef *o;
    mcmon    nxt;
    int      pass;                     /* pass 1: swap one piece big enough */
                      /* pass 2: swap enough pieces to add up to right size */
    ushort   tot;

    MCMGLBCTX(ctx);

    for (pass = 1, tot = 0 ; pass < 3 && tot < siz ; ++pass)
    {
        for (n = ctx->mcmcxlru ; n != MCMONINV && tot < siz ; n = nxt)
        {
            o = mcmgobje(ctx, n);
            nxt = o->mcmonxt;             /* get next now, as we may unlink */
            if (!(o->mcmoflg & (MCMOFLOCK | MCMOFNOSWAP | MCMOFPAGE))
                 && (pass == 2 || o->mcmosiz >= siz))
            {
                /* toss out, and add into size if successful */
                if (mcmtoss(ctx, n)) tot += o->mcmosiz;
            }
        }
    }
    
    /* if we managed to remove anything, return TRUE, otherwise FALSE */
    return(tot != 0);
}